

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::UpdateMergeFetch<duckdb::string_t>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,
               Vector *result)

{
  UpdateInfo *current;
  UndoBufferPointer update_ptr;
  string_t *result_data;
  anon_class_8_1_f18654ec local_80;
  UndoBufferPointer local_78;
  string_t *local_60;
  UndoBufferReference local_58;
  
  local_60 = (string_t *)result->data;
  local_80.result_data = &local_60;
  if ((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
     ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
    UpdateMergeFetch<duckdb::string_t>::anon_class_8_1_f18654ec::operator()(&local_80,info);
  }
  local_78.entry = (info->next).entry;
  local_78.position = (info->next).position;
  while (local_78.entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin(&local_58,&local_78);
    current = (UpdateInfo *)UndoBufferReference::Ptr(&local_58);
    if ((start_time < (current->version_number).super___atomic_base<unsigned_long>._M_i) &&
       ((current->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
      UpdateMergeFetch<duckdb::string_t>::anon_class_8_1_f18654ec::operator()(&local_80,current);
    }
    local_78.entry = (current->next).entry;
    local_78.position = (current->next).position;
    BufferHandle::~BufferHandle(&local_58.handle);
  }
  return;
}

Assistant:

static void UpdateMergeFetch(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id,
	                                  [&](UpdateInfo &current) { MergeUpdateInfo<T>(current, result_data); });
}